

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O0

walk_result __thiscall
jsoncons::jsonschema::
one_of_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
do_walk(one_of_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
        *this,eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              *context,basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *instance,
       json_pointer *instance_location,walk_reporter_type *reporter)

{
  walk_result wVar1;
  string *name;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *parent;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *peVar2;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *in_RSI;
  keyword_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  item_context;
  size_t i;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  this_context;
  walk_result result;
  undefined4 in_stack_ffffffffffffff08;
  walk_result in_stack_ffffffffffffff0c;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *this_00
  ;
  uri *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff40;
  uint uVar3;
  undefined4 in_stack_ffffffffffffff44;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *local_78;
  walk_result local_4;
  
  name = keyword_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::
         keyword_name_abi_cxx11_
                   ((keyword_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                     *)in_RDI);
  parent = (eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
            *)keyword_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              ::schema(in_RDI);
  (*(in_RDI->super_validation_message_factory)._vptr_validation_message_factory[6])();
  wVar1 = std::
          function<jsoncons::jsonschema::walk_result_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::uri_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::jsonpointer::basic_json_pointer<char>_&)>
          ::operator()((function<jsoncons::jsonschema::walk_result_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::uri_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::jsonpointer::basic_json_pointer<char>_&)>
                        *)name,in_R8,
                       (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)in_RDI,
                       in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                       (basic_json_pointer<char> *)
                       CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  if (wVar1 == abort) {
    local_4 = abort;
  }
  else {
    keyword_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::
    keyword_name_abi_cxx11_
              ((keyword_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                *)in_RDI);
    eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
    eval_context((eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),parent,name);
    local_78 = (eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *)0x0;
    while (this_00 = local_78,
          peVar2 = (eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    *)std::
                      vector<std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                      ::size((vector<std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                              *)(in_RDI + 1)), this_00 < peVar2) {
      eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
      eval_context((eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),parent,
                   (size_t)name);
      std::
      vector<std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
      ::operator[]((vector<std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                    *)(in_RDI + 1),(size_type)local_78);
      std::
      unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
      ::operator->((unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                    *)0x83b5fc);
      in_stack_ffffffffffffff0c =
           validator_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           ::walk((validator_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   *)in_RDI,in_RSI,
                  (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this_00,
                  (json_pointer *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                  (walk_reporter_type *)0x83b621);
      if (in_stack_ffffffffffffff0c == abort) {
        local_4 = abort;
      }
      uVar3 = (uint)(in_stack_ffffffffffffff0c == abort);
      eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
      ~eval_context(this_00);
      if (uVar3 != 0) goto LAB_0083b6c8;
      local_78 = (eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  *)&(((anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_5
                        *)&local_78->dynamic_scope_)->common_).tag_;
      in_stack_ffffffffffffff40 = 0;
    }
    local_4 = advance;
LAB_0083b6c8:
    eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
    ~eval_context(this_00);
  }
  return local_4;
}

Assistant:

walk_result do_walk(const eval_context<Json>& context, const Json& instance,
            const jsonpointer::json_pointer& instance_location, const walk_reporter_type& reporter) const final
        {
            walk_result result = reporter(this->keyword_name(), this->schema(), this->schema_location(), instance, instance_location);
            if (result == walk_result::abort)
            {
                return result;
            }

            eval_context<Json> this_context(context, this->keyword_name());

            for (std::size_t i = 0; i < validators_.size(); ++i) 
            {
                eval_context<Json> item_context(this_context, i);

                result = validators_[i]->walk(item_context, instance, instance_location, reporter);
                if (result == walk_result::abort)
                {
                    return result;
                }
            }

            return walk_result::advance;
        }